

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

LengthPercentageAuto
Rml::ComputeLengthPercentageAuto
          (Property *property,float font_size,float document_font_size,float dp_ratio,
          Vector2f vp_dimensions)

{
  NumericValue value;
  float fVar1;
  ulong uStack_30;
  
  if (property->unit == KEYWORD) {
    fVar1 = 0.0;
    uStack_30 = 0;
  }
  else if (property->unit == PERCENT) {
    fVar1 = Property::Get<float>(property);
    uStack_30 = 2;
  }
  else {
    value = Property::GetNumericValue(property);
    fVar1 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
    uStack_30 = 1;
  }
  return (LengthPercentageAuto)((ulong)(uint)fVar1 << 0x20 | uStack_30);
}

Assistant:

Style::LengthPercentageAuto ComputeLengthPercentageAuto(const Property* property, float font_size, float document_font_size, float dp_ratio,
	Vector2f vp_dimensions)
{
	using namespace Style;
	if (property->unit == Unit::PERCENT)
		return LengthPercentageAuto(LengthPercentageAuto::Percentage, property->Get<float>());
	else if (property->unit == Unit::KEYWORD)
		return LengthPercentageAuto(LengthPercentageAuto::Auto);

	return LengthPercentageAuto(LengthPercentageAuto::Length,
		ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions));
}